

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigMiterStatus(Ivy_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  int local_38;
  int local_34;
  int CountUndecided;
  int CountNonConst0;
  int CountConst0;
  int i;
  Ivy_Obj_t *pObjNew;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pMan_local;
  
  local_34 = 0;
  local_38 = 0;
  if (pMan->pData == (void *)0x0) {
    for (CountNonConst0 = 0; iVar2 = Vec_PtrSize(pMan->vPos), CountNonConst0 < iVar2;
        CountNonConst0 = CountNonConst0 + 1) {
      pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(pMan->vPos,CountNonConst0);
      pIVar4 = Ivy_ObjChild0(pIVar4);
      if (pIVar4 == pMan->pConst1) {
        local_34 = local_34 + 1;
      }
      else {
        pIVar5 = Ivy_Not(pMan->pConst1);
        if (pIVar4 != pIVar5) {
          pIVar5 = Ivy_Regular(pIVar4);
          uVar1 = *(uint *)&pIVar5->field_0x8;
          uVar3 = Ivy_IsComplement(pIVar4);
          if ((uVar1 >> 7 & 1) == uVar3) {
            local_38 = local_38 + 1;
          }
          else {
            local_34 = local_34 + 1;
          }
        }
      }
    }
    if (local_34 == 0) {
      if (local_38 == 0) {
        pMan_local._4_4_ = 1;
      }
      else {
        pMan_local._4_4_ = -1;
      }
    }
    else {
      pMan_local._4_4_ = 0;
    }
  }
  else {
    pMan_local._4_4_ = 0;
  }
  return pMan_local._4_4_;
}

Assistant:

int Ivy_FraigMiterStatus( Ivy_Man_t * pMan )
{
    Ivy_Obj_t * pObj, * pObjNew;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
    if ( pMan->pData )
        return 0;
    Ivy_ManForEachPo( pMan, pObj, i )
    {
        pObjNew = Ivy_ObjChild0(pObj);
        // check if the output is constant 1
        if ( pObjNew == pMan->pConst1 )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is constant 0
        if ( pObjNew == Ivy_Not(pMan->pConst1) )
        {
            CountConst0++;
            continue;
        }
/*
        // check if the output is a primary input
        if ( Ivy_ObjIsPi(Ivy_Regular(pObjNew)) )
        {
            CountNonConst0++;
            continue;
        }
*/
        // check if the output can be constant 0
        if ( Ivy_Regular(pObjNew)->fPhase != (unsigned)Ivy_IsComplement(pObjNew) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }
/*
    if ( p->pParams->fVerbose )
    {
        printf( "Miter has %d outputs. ", Ivy_ManPoNum(p->pManAig) );
        printf( "Const0 = %d.  ", CountConst0 );
        printf( "NonConst0 = %d.  ", CountNonConst0 );
        printf( "Undecided = %d.  ", CountUndecided );
        printf( "\n" );
    }
*/
    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}